

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O3

double NEST::NESTcalc::interpolateFunction
                 (vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                  *func,double x,bool isLogLog)

{
  pointer ppVar1;
  pointer ppVar2;
  long lVar3;
  undefined3 in_register_00000031;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  ppVar1 = (func->
           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(func->
                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1;
  if (CONCAT31(in_register_00000031,isLogLog) == 0) {
    lVar3 = lVar3 >> 4;
    do {
      ppVar2 = ppVar1;
      lVar3 = lVar3 + -1;
      if (lVar3 == 0) goto LAB_001103cd;
      dVar5 = ppVar2->first;
      ppVar1 = ppVar2 + 1;
    } while ((x <= dVar5) || (ppVar2[1].first < x));
    dVar5 = (x - dVar5) * ((ppVar2[1].second - ppVar2->second) / (ppVar2[1].first - dVar5)) +
            ppVar2->second;
  }
  else {
    if (lVar3 != 0x10) {
      lVar3 = 0;
      uVar4 = 0;
      do {
        dVar5 = log10(*(double *)((long)&ppVar1->first + lVar3));
        dVar6 = log10(*(double *)
                       ((long)&(func->
                               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                               )._M_impl.super__Vector_impl_data._M_start[1].first + lVar3));
        dVar7 = log10(x);
        if (dVar5 < dVar7) {
          dVar7 = log10(x);
          if (dVar7 < dVar6) {
            dVar7 = log10(*(double *)
                           ((long)&((func->
                                    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start)->second + lVar3));
            dVar8 = log10(*(double *)
                           ((long)&(func->
                                   super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start[1].second + lVar3));
            dVar9 = log10(x);
            dVar5 = pow(10.0,((dVar8 - dVar7) / (dVar6 - dVar5)) * (dVar9 - dVar5) + dVar7);
            return dVar5;
          }
        }
        uVar4 = uVar4 + 1;
        ppVar1 = (func->
                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        lVar3 = lVar3 + 0x10;
      } while (uVar4 < ((long)(func->
                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1 >> 4) - 1U)
      ;
    }
LAB_001103cd:
    dVar5 = 0.0;
  }
  return dVar5;
}

Assistant:

double NESTcalc::interpolateFunction(
    const std::vector<std::pair<double, double> > &func, double x,
    bool isLogLog) {
  // Linear interpolation
  if (!isLogLog) {
    double y_desired = 0;
    for (int iP = 0; iP < func.size() - 1; ++iP) {
      double x1 = func[iP].first;
      double x2 = func[iP + 1].first;
      if (x1 < x && x2 >= x) {
        double y1 = func[iP].second;
        double y2 = func[iP + 1].second;
        double slope = (y2 - y1) / (x2 - x1);
        y_desired = y1 + (slope * (x - x1));
        break;
      }
    }
    return y_desired;
  }

  // Linear interpolation on a log-log scale (more accurate at high fields,
  // where points are far apart on a linear scale)
  else {
    double y_desired = 0;
    for (int iP = 0; iP < func.size() - 1; ++iP) {
      double logx1 = log10(func[iP].first);
      double logx2 = log10(func[iP + 1].first);
      if (logx1 < log10(x) && logx2 > log10(x)) {
        double logy1 = log10(func[iP].second);
        double logy2 = log10(func[iP + 1].second);
        double slope = (logy2 - logy1) / (logx2 - logx1);
        double logy_desired = logy1 + slope * (log10(x) - logx1);
        y_desired = pow(10, logy_desired);
        break;
      }
    }
    return y_desired;
  }
}